

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_tasking.cpp
# Opt level: O0

void * __kmp_task_reduction_modifier_init<kmp_taskred_input>
                 (ident_t *loc,int gtid,int is_ws,int num,kmp_taskred_input *data)

{
  bool bVar1;
  kmp_taskgroup_t *tg_00;
  kmp_info_t *th;
  void *__dest;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  ident_t *unaff_retaddr;
  kmp_taskgroup_t *tg;
  void *reduce_data;
  kmp_team_t *team;
  kmp_int32 nth;
  kmp_info_t *thr;
  void *in_stack_ffffffffffffffa8;
  atomic<void_*> *in_stack_ffffffffffffffb0;
  atomic<void_*> *in_stack_ffffffffffffffb8;
  kmp_team_p *data_00;
  int num_00;
  kmp_info_t *thr_00;
  undefined4 in_stack_ffffffffffffffe0;
  undefined8 in_stack_fffffffffffffff8;
  
  thr_00 = __kmp_threads[in_ESI];
  num_00 = (thr_00->th).th_team_nproc;
  __kmpc_taskgroup(unaff_retaddr,(int)((ulong)in_stack_fffffffffffffff8 >> 0x20));
  if (num_00 == 1) {
    th = (kmp_info_t *)((thr_00->th).th_current_task)->td_taskgroup;
  }
  else {
    data_00 = (thr_00->th).th_team;
    tg_00 = (kmp_taskgroup_t *)
            std::atomic<void_*>::load
                      (in_stack_ffffffffffffffb8,
                       (memory_order)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    if ((tg_00 == (kmp_taskgroup_t *)0x0) &&
       (bVar1 = __kmp_atomic_compare_store<void*>
                          (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(void *)0x171285),
       bVar1)) {
      th = (kmp_info_t *)
           __kmp_task_reduction_init<kmp_taskred_input>
                     (in_ESI,in_EDX,(kmp_taskred_input *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0))
      ;
      __dest = ___kmp_thread_malloc(th,(size_t)in_stack_ffffffffffffffa8);
      memcpy(__dest,*(void **)(th->th_pad + 0x10),(long)in_ECX * 0x48);
      std::atomic<void_*>::store
                ((atomic<void_*> *)&data_00->t,__dest,(memory_order)((ulong)th >> 0x20));
    }
    else {
      while (tg_00 = (kmp_taskgroup_t *)
                     std::atomic<void_*>::load
                               ((atomic<void_*> *)tg_00,
                                (memory_order)((ulong)in_stack_ffffffffffffffb0 >> 0x20)),
            tg_00 == (kmp_taskgroup_t *)&DAT_00000001) {
        __kmp_x86_pause();
      }
      th = (kmp_info_t *)((thr_00->th).th_current_task)->td_taskgroup;
      __kmp_task_reduction_init_copy<kmp_taskred_input>
                (thr_00,num_00,(kmp_taskred_input *)&data_00->t,tg_00,th);
    }
  }
  return th;
}

Assistant:

void *__kmp_task_reduction_modifier_init(ident_t *loc, int gtid, int is_ws,
                                         int num, T *data) {
  kmp_info_t *thr = __kmp_threads[gtid];
  kmp_int32 nth = thr->th.th_team_nproc;
  __kmpc_taskgroup(loc, gtid); // form new taskgroup first
  if (nth == 1) {
    KA_TRACE(10,
             ("__kmpc_reduction_modifier_init: T#%d, tg %p, exiting nth=1\n",
              gtid, thr->th.th_current_task->td_taskgroup));
    return (void *)thr->th.th_current_task->td_taskgroup;
  }
  kmp_team_t *team = thr->th.th_team;
  void *reduce_data;
  kmp_taskgroup_t *tg;
  reduce_data = KMP_ATOMIC_LD_RLX(&team->t.t_tg_reduce_data[is_ws]);
  if (reduce_data == NULL &&
      __kmp_atomic_compare_store(&team->t.t_tg_reduce_data[is_ws], reduce_data,
                                 (void *)1)) {
    // single thread enters this block to initialize common reduction data
    KMP_DEBUG_ASSERT(reduce_data == NULL);
    // first initialize own data, then make a copy other threads can use
    tg = (kmp_taskgroup_t *)__kmp_task_reduction_init<T>(gtid, num, data);
    reduce_data = __kmp_thread_malloc(thr, num * sizeof(kmp_taskred_data_t));
    KMP_MEMCPY(reduce_data, tg->reduce_data, num * sizeof(kmp_taskred_data_t));
    // fini counters should be 0 at this point
    KMP_DEBUG_ASSERT(KMP_ATOMIC_LD_RLX(&team->t.t_tg_fini_counter[0]) == 0);
    KMP_DEBUG_ASSERT(KMP_ATOMIC_LD_RLX(&team->t.t_tg_fini_counter[1]) == 0);
    KMP_ATOMIC_ST_REL(&team->t.t_tg_reduce_data[is_ws], reduce_data);
  } else {
    while (
        (reduce_data = KMP_ATOMIC_LD_ACQ(&team->t.t_tg_reduce_data[is_ws])) ==
        (void *)1) { // wait for task reduction initialization
      KMP_CPU_PAUSE();
    }
    KMP_DEBUG_ASSERT(reduce_data > (void *)1); // should be valid pointer here
    tg = thr->th.th_current_task->td_taskgroup;
    __kmp_task_reduction_init_copy<T>(thr, num, data, tg, reduce_data);
  }
  return tg;
}